

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O0

bool __thiscall
cfd::TransactionController::VerifyInputSignature
          (TransactionController *this,ByteData *signature,Pubkey *pubkey,Txid *txid,uint32_t vout,
          SigHashType *sighash_type,Amount *value,WitnessVersion version)

{
  bool bVar1;
  Pubkey *in_RDX;
  ByteData *in_RSI;
  SigHashType *in_RDI;
  SigHashType *in_R9;
  Pubkey *unaff_retaddr;
  uint32_t in_stack_0000000c;
  undefined4 in_stack_00000010;
  undefined4 in_stack_00000014;
  TransactionController *in_stack_00000018;
  Amount *in_stack_00000030;
  WitnessVersion in_stack_00000038;
  ByteData sighash;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  ByteData256 local_70;
  SigHashType local_54;
  ByteData local_48 [2];
  Pubkey *local_18;
  ByteData *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  core::SigHashType::SigHashType(&local_54,in_R9);
  CreateSignatureHash(in_stack_00000018,(Txid *)CONCAT44(in_stack_00000014,in_stack_00000010),
                      in_stack_0000000c,unaff_retaddr,in_RDI,in_stack_00000030,in_stack_00000038);
  core::ByteData::GetBytes(&local_88,local_48);
  core::ByteData256::ByteData256(&local_70,&local_88);
  bVar1 = core::SignatureUtil::VerifyEcSignature(&local_70,local_18,local_10);
  core::ByteData256::~ByteData256((ByteData256 *)0x540408);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_R9);
  core::ByteData::~ByteData((ByteData *)0x54041f);
  return bVar1;
}

Assistant:

bool TransactionController::VerifyInputSignature(
    const ByteData& signature, const Pubkey& pubkey, const Txid& txid,
    uint32_t vout, SigHashType sighash_type, const Amount& value,
    WitnessVersion version) const {
  auto sighash = this->CreateSignatureHash(
      txid, vout, pubkey, sighash_type, value, version);
  return SignatureUtil::VerifyEcSignature(
      ByteData256(sighash.GetBytes()), pubkey, signature);
}